

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_5::WireFormatTest_EnumsInSync_Test::
~WireFormatTest_EnumsInSync_Test(WireFormatTest_EnumsInSync_Test *this)

{
  WireFormatTest_EnumsInSync_Test *this_local;
  
  ~WireFormatTest_EnumsInSync_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(WireFormatTest, EnumsInSync) {
  // Verify that WireFormatLite::FieldType and WireFormatLite::CppType match
  // FieldDescriptor::Type and FieldDescriptor::CppType.

  EXPECT_EQ(absl::implicit_cast<int>(FieldDescriptor::MAX_TYPE),
            absl::implicit_cast<int>(WireFormatLite::MAX_FIELD_TYPE));
  EXPECT_EQ(absl::implicit_cast<int>(FieldDescriptor::MAX_CPPTYPE),
            absl::implicit_cast<int>(WireFormatLite::MAX_CPPTYPE));

  for (int i = 1; i <= WireFormatLite::MAX_FIELD_TYPE; i++) {
    EXPECT_EQ(absl::implicit_cast<int>(FieldDescriptor::TypeToCppType(
                  static_cast<FieldDescriptor::Type>(i))),
              absl::implicit_cast<int>(WireFormatLite::FieldTypeToCppType(
                  static_cast<WireFormatLite::FieldType>(i))));
  }
}